

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsbDec6.c
# Opt level: O2

uint Rsb_DecPerformInt(Rsb_Man_t *p,int nVars,word *f,word **g,int nGs,int nGsAll,int fFindAll)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  word wVar6;
  word *__s;
  long lVar7;
  uint *puVar8;
  uint *pPat;
  int nCexes;
  ulong uVar9;
  Rsb_Man_t *pRVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  uint uTruth;
  int iCexB;
  int iCexA;
  uint *local_108;
  int local_100;
  int local_fc;
  long local_f8;
  word *local_f0;
  word *local_e8;
  word **local_e0;
  long local_d8;
  Rsb_Man_t *local_d0;
  long local_c8;
  long local_c0;
  word *pDivs [16];
  
  __s = p->vCexes->pArray;
  pPat = (uint *)p->vDecPats->pArray;
  uTruth = 0;
  local_100 = nGsAll;
  local_fc = nVars;
  local_e8 = f;
  local_e0 = g;
  memset(__s,0,(long)nGsAll << 3);
  p->vTries->nSize = 0;
  p->vFanins->nSize = 1;
  local_f8 = CONCAT44(local_f8._4_4_,nGs);
  uVar9 = 0;
  if (0 < nGs) {
    uVar9 = (ulong)(uint)nGs;
  }
  nCexes = 0;
  local_108 = pPat;
  local_f0 = __s;
  local_d0 = p;
  for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
    if (__s[uVar11] == 0) {
      pDivs[0] = local_e0[uVar11];
      pVVar2 = local_d0->vFanins;
      *pVVar2->pArray = (int)uVar11;
      uTruth = Rsb_DecCheck(local_fc,local_e8,pDivs,pVVar2->nSize,pPat,&iCexA,&iCexB);
      pRVar10 = local_d0;
      iVar5 = iCexA;
      iVar4 = iCexB;
      if (uTruth == 0) {
        if (nCexes == 0x40) {
          return 0;
        }
        Rsb_DecVerifyCex(local_e8,pDivs,local_d0->vFanins->nSize,iCexA,iCexB);
        __s = local_f0;
        local_d8 = CONCAT44(local_d8._4_4_,nCexes + 1);
        Rsb_DecRecordCex(local_e0,local_100,iVar5,iVar4,local_f0,nCexes);
        if (pRVar10->fVerbose != 0) {
          Vec_IntPush(pRVar10->vTries,(int)uVar11);
          Vec_IntPush(pRVar10->vTries,-1);
        }
        pPat = local_108;
        nCexes = (int)local_d8;
      }
      else {
        if (fFindAll == 0) {
          return uTruth;
        }
        wVar6 = Abc_Tt6Stretch((ulong)uTruth,1);
        uTruth = (uint)wVar6;
        Kit_DsdPrintFromTruth(&uTruth,1);
        printf("   ");
        Vec_IntPrint(local_d0->vFanins);
        __s = local_f0;
      }
    }
  }
  if (local_d0->nDecMax != 1) {
    local_d0->vFanins->nSize = 2;
    local_d8 = (long)(int)local_f8;
    pRVar10 = local_d0;
    for (lVar12 = 1; lVar12 < local_d8; lVar12 = lVar12 + 1) {
      for (lVar7 = 0; lVar12 != lVar7; lVar7 = lVar7 + 1) {
        if ((__s[lVar12] & __s[lVar7]) == 0) {
          pDivs[0] = local_e0[lVar12];
          pVVar2 = pRVar10->vFanins;
          piVar3 = pVVar2->pArray;
          *piVar3 = (int)lVar12;
          pDivs[1] = local_e0[lVar7];
          piVar3[1] = (int)lVar7;
          uTruth = Rsb_DecCheck(local_fc,local_e8,pDivs,pVVar2->nSize,pPat,&iCexA,&iCexB);
          iVar5 = iCexA;
          iVar4 = iCexB;
          if (uTruth == 0) {
            if (nCexes == 0x40) {
              return 0;
            }
            Rsb_DecVerifyCex(local_e8,pDivs,pRVar10->vFanins->nSize,iCexA,iCexB);
            pRVar10 = local_d0;
            __s = local_f0;
            iVar1 = nCexes + 1;
            Rsb_DecRecordCex(local_e0,local_100,iVar5,iVar4,local_f0,nCexes);
            pPat = local_108;
            nCexes = iVar1;
            if (pRVar10->fVerbose != 0) {
              Vec_IntPush(pRVar10->vTries,(int)lVar12);
              Vec_IntPush(pRVar10->vTries,(int)lVar7);
              Vec_IntPush(pRVar10->vTries,-1);
              pPat = local_108;
            }
          }
          else {
            if (fFindAll == 0) {
              return uTruth;
            }
            wVar6 = Abc_Tt6Stretch((ulong)uTruth,2);
            uTruth = (uint)wVar6;
            Kit_DsdPrintFromTruth(&uTruth,2);
            printf("   ");
            Vec_IntPrint(pRVar10->vFanins);
            __s = local_f0;
          }
        }
      }
    }
    if (pRVar10->nDecMax != 2) {
      pRVar10->vFanins->nSize = 3;
      for (lVar12 = 2; lVar12 < local_d8; lVar12 = lVar12 + 1) {
        local_c8 = lVar12;
        for (puVar8 = (uint *)0x1; puVar8 != (uint *)lVar12; puVar8 = (uint *)((long)puVar8 + 1)) {
          local_108 = puVar8;
          for (lVar7 = 0; puVar8 != (uint *)lVar7; lVar7 = lVar7 + 1) {
            if ((__s[lVar7] & __s[(long)puVar8] & __s[lVar12]) == 0) {
              pDivs[0] = local_e0[lVar12];
              pVVar2 = pRVar10->vFanins;
              piVar3 = pVVar2->pArray;
              *piVar3 = (int)lVar12;
              pDivs[1] = local_e0[(long)puVar8];
              piVar3[1] = (int)puVar8;
              pDivs[2] = local_e0[lVar7];
              piVar3[2] = (int)lVar7;
              uTruth = Rsb_DecCheck(local_fc,local_e8,pDivs,pVVar2->nSize,pPat,&iCexA,&iCexB);
              iVar5 = iCexA;
              iVar4 = iCexB;
              if (uTruth == 0) {
                if (nCexes == 0x40) {
                  return 0;
                }
                Rsb_DecVerifyCex(local_e8,pDivs,pRVar10->vFanins->nSize,iCexA,iCexB);
                __s = local_f0;
                local_f8 = CONCAT44(local_f8._4_4_,nCexes + 1);
                Rsb_DecRecordCex(local_e0,local_100,iVar5,iVar4,local_f0,nCexes);
                lVar12 = local_c8;
                if (pRVar10->fVerbose == 0) {
                  puVar8 = local_108;
                  nCexes = (int)local_f8;
                }
                else {
                  Vec_IntPush(pRVar10->vTries,(int)local_c8);
                  puVar8 = local_108;
                  Vec_IntPush(pRVar10->vTries,(int)local_108);
                  Vec_IntPush(pRVar10->vTries,(int)lVar7);
                  Vec_IntPush(pRVar10->vTries,-1);
                  nCexes = (int)local_f8;
                }
              }
              else {
                if (fFindAll == 0) {
                  return uTruth;
                }
                wVar6 = Abc_Tt6Stretch((ulong)uTruth,3);
                uTruth = (uint)wVar6;
                Kit_DsdPrintFromTruth(&uTruth,3);
                printf("   ");
                Vec_IntPrint(pRVar10->vFanins);
                __s = local_f0;
                puVar8 = local_108;
              }
            }
          }
        }
      }
      if (pRVar10->nDecMax != 3) {
        pRVar10->vFanins->nSize = 4;
        lVar12 = 3;
        do {
          puVar8 = (uint *)0x2;
          local_c0 = lVar12;
          if (local_d8 <= lVar12) {
            return 0;
          }
          for (; lVar7 = 1, local_108 = puVar8, puVar8 != (uint *)lVar12;
              puVar8 = (uint *)((long)puVar8 + 1)) {
            for (; (uint *)lVar7 != puVar8; lVar7 = lVar7 + 1) {
              local_f8 = lVar7;
              for (lVar13 = 0; lVar7 != lVar13; lVar13 = lVar13 + 1) {
                if ((local_f0[lVar13] & local_f0[(long)puVar8] & local_f0[lVar12] & local_f0[lVar7])
                    == 0) {
                  pDivs[0] = local_e0[lVar12];
                  pVVar2 = pRVar10->vFanins;
                  piVar3 = pVVar2->pArray;
                  *piVar3 = (int)lVar12;
                  pDivs[1] = local_e0[(long)puVar8];
                  piVar3[1] = (int)puVar8;
                  pDivs[2] = local_e0[lVar7];
                  piVar3[2] = (int)lVar7;
                  pDivs[3] = local_e0[lVar13];
                  piVar3[3] = (int)lVar13;
                  uTruth = Rsb_DecCheck(local_fc,local_e8,pDivs,pVVar2->nSize,pPat,&iCexA,&iCexB);
                  iVar5 = iCexA;
                  iVar4 = iCexB;
                  if (uTruth == 0) {
                    if (nCexes == 0x40) {
                      return 0;
                    }
                    Rsb_DecVerifyCex(local_e8,pDivs,pRVar10->vFanins->nSize,iCexA,iCexB);
                    pRVar10 = local_d0;
                    local_c8 = CONCAT44(local_c8._4_4_,nCexes + 1);
                    Rsb_DecRecordCex(local_e0,local_100,iVar5,iVar4,local_f0,nCexes);
                    lVar12 = local_c0;
                    if (pRVar10->fVerbose == 0) {
                      puVar8 = local_108;
                      lVar7 = local_f8;
                      nCexes = (int)local_c8;
                    }
                    else {
                      Vec_IntPush(pRVar10->vTries,(int)local_c0);
                      Vec_IntPush(pRVar10->vTries,(int)local_108);
                      lVar7 = local_f8;
                      Vec_IntPush(pRVar10->vTries,(int)local_f8);
                      Vec_IntPush(pRVar10->vTries,(int)lVar13);
                      Vec_IntPush(pRVar10->vTries,-1);
                      puVar8 = local_108;
                      nCexes = (int)local_c8;
                    }
                  }
                  else {
                    if (fFindAll == 0) {
                      return uTruth;
                    }
                    wVar6 = Abc_Tt6Stretch((ulong)uTruth,4);
                    uTruth = (uint)wVar6;
                    Kit_DsdPrintFromTruth(&uTruth,4);
                    printf("   ");
                    Vec_IntPrint(pRVar10->vFanins);
                    puVar8 = local_108;
                    lVar7 = local_f8;
                  }
                }
              }
            }
          }
          lVar12 = lVar12 + 1;
        } while( true );
      }
    }
  }
  return 0;
}

Assistant:

unsigned Rsb_DecPerformInt( Rsb_Man_t * p, int nVars, word * f, word ** g, int nGs, int nGsAll, int fFindAll ) 
{
    word * pCexes = Vec_WrdArray(p->vCexes);
    unsigned * pPat = (unsigned *)Vec_IntArray(p->vDecPats);
    /*
    The following filtering hueristic can be used:
    after the first round (if there is more than 5 cexes, 
    remove all the divisors, except fanins of the node
    This should lead to a speadup without sacrifying quality.

    Another idea is to precompute several counter-examples
    like the first and last 0 and 1 mints of the function
    which yields 4 cexes.
    */

    word * pDivs[16];
    unsigned uTruth = 0;
    int i, k, j, n, iCexA, iCexB, nCexes = 0;
    memset( pCexes, 0, sizeof(word) * nGsAll );  
    Vec_IntClear( p->vTries );
    // populate the counter-examples with the three most obvious
//    nCexes = Rsb_DecInitCexes( nVars, f, g, nGs, nGsAll, pCexes, vTries );
    // start by checking each function
    p->vFanins->nSize = 1;
    for ( i = 0; i < nGs; i++ )
    {
        if ( pCexes[i] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 1 );
                Kit_DsdPrintFromTruth( &uTruth, 1 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 1 )
        return 0;
    // continue by checking pairs
    p->vFanins->nSize = 2;
    for ( i = 1; i < nGs; i++ )
    for ( k = 0; k < i; k++ )
    {
        if ( pCexes[i] & pCexes[k] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 2 );
                Kit_DsdPrintFromTruth( &uTruth, 2 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 2 )
        return 0;
    // continue by checking triples
    p->vFanins->nSize = 3;
    for ( i = 2; i < nGs; i++ )
    for ( k = 1; k < i; k++ )
    for ( j = 0; j < k; j++ )
    {
        if ( pCexes[i] & pCexes[k] & pCexes[j] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        pDivs[2] = g[j];  p->vFanins->pArray[2] = j;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 3 );
                Kit_DsdPrintFromTruth( &uTruth, 3 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, j );
        Vec_IntPush( p->vTries, -1 );
    }
    if ( p->nDecMax == 3 )
        return 0;
    // continue by checking quadras
    p->vFanins->nSize = 4;
    for ( i = 3; i < nGs; i++ )
    for ( k = 2; k < i; k++ )
    for ( j = 1; j < k; j++ )
    for ( n = 0; n < j; n++ )
    {
        if ( pCexes[i] & pCexes[k] & pCexes[j] & pCexes[n] )
            continue;
        pDivs[0] = g[i];  p->vFanins->pArray[0] = i;
        pDivs[1] = g[k];  p->vFanins->pArray[1] = k;
        pDivs[2] = g[j];  p->vFanins->pArray[2] = j;
        pDivs[3] = g[n];  p->vFanins->pArray[3] = n;
        uTruth = Rsb_DecCheck( nVars, f, pDivs, Vec_IntSize(p->vFanins), pPat, &iCexA, &iCexB );
        if ( uTruth )
        {
            if ( fFindAll )
            {
                uTruth = (unsigned)Abc_Tt6Stretch( (word)uTruth, 4 );
                Kit_DsdPrintFromTruth( &uTruth, 4 ); printf( "   " );
                Vec_IntPrint(p->vFanins);
                continue;
            }
            else
                return uTruth;
        }
        if ( nCexes == 64 )
            return 0;
        Rsb_DecVerifyCex( f, pDivs, Vec_IntSize(p->vFanins), iCexA, iCexB );
        Rsb_DecRecordCex( g, nGsAll, iCexA, iCexB, pCexes, nCexes++ );
        if ( !p->fVerbose )
            continue;
        Vec_IntPush( p->vTries, i );
        Vec_IntPush( p->vTries, k );
        Vec_IntPush( p->vTries, j );
        Vec_IntPush( p->vTries, n );
        Vec_IntPush( p->vTries, -1 );
    }
//    printf( "%d ", nCexes );
    if ( p->nDecMax == 4 )
        return 0;
    return 0;
}